

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFARegExecRollBack(xmlRegExecCtxtPtr exec)

{
  xmlRegExecCtxtPtr exec_local;
  
  if (exec->status == 0) {
    if (exec->nbRollbacks < 1) {
      exec->status = -1;
    }
    else {
      exec->nbRollbacks = exec->nbRollbacks + -1;
      exec->state = exec->rollbacks[exec->nbRollbacks].state;
      exec->index = exec->rollbacks[exec->nbRollbacks].index;
      exec->transno = exec->rollbacks[exec->nbRollbacks].nextbranch;
      if (0 < exec->comp->nbCounters) {
        if (exec->rollbacks[exec->nbRollbacks].counts == (int *)0x0) {
          exec->status = -4;
        }
        else if (exec->counts != (int *)0x0) {
          memcpy(exec->counts,exec->rollbacks[exec->nbRollbacks].counts,
                 (long)exec->comp->nbCounters << 2);
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlFARegExecRollBack(xmlRegExecCtxtPtr exec) {
    if (exec->status != XML_REGEXP_OK)
        return;
    if (exec->nbRollbacks <= 0) {
	exec->status = XML_REGEXP_NOT_FOUND;
	return;
    }
    exec->nbRollbacks--;
    exec->state = exec->rollbacks[exec->nbRollbacks].state;
    exec->index = exec->rollbacks[exec->nbRollbacks].index;
    exec->transno = exec->rollbacks[exec->nbRollbacks].nextbranch;
    if (exec->comp->nbCounters > 0) {
	if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
	    exec->status = XML_REGEXP_INTERNAL_ERROR;
	    return;
	}
	if (exec->counts) {
	    memcpy(exec->counts, exec->rollbacks[exec->nbRollbacks].counts,
	       exec->comp->nbCounters * sizeof(int));
	}
    }
}